

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

int dwarf_get_universalbinary_count
              (Dwarf_Debug dbg,Dwarf_Unsigned *current_index,Dwarf_Unsigned *available_count)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) &&
     (uVar1 = dbg->de_universalbinary_count, (ulong)uVar1 != 0)) {
    if (current_index != (Dwarf_Unsigned *)0x0) {
      *current_index = (ulong)dbg->de_universalbinary_index;
    }
    iVar2 = 0;
    if (available_count != (Dwarf_Unsigned *)0x0) {
      *available_count = (ulong)uVar1;
    }
  }
  return iVar2;
}

Assistant:

int
dwarf_get_universalbinary_count(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *current_index,
    Dwarf_Unsigned *available_count)
{
    if (IS_INVALID_DBG(dbg)) {
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_universalbinary_count ) {
        return DW_DLV_NO_ENTRY;
    }
    if (current_index) {
        *current_index = dbg->de_universalbinary_index;
    }
    if (available_count) {
        *available_count = dbg->de_universalbinary_count;
    }
    return DW_DLV_OK;
}